

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udataswp.cpp
# Opt level: O0

int32_t udata_swapDataHeader_63
                  (UDataSwapper *ds,void *inData,int32_t length,void *outData,UErrorCode *pErrorCode
                  )

{
  UBool UVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  ushort uVar4;
  bool bVar5;
  int32_t maxLength;
  char *s;
  DataHeader *outHeader;
  uint16_t infoSize;
  uint16_t headerSize;
  DataHeader *pHeader;
  UErrorCode *pErrorCode_local;
  void *outData_local;
  int32_t length_local;
  void *inData_local;
  UDataSwapper *ds_local;
  
  if ((pErrorCode == (UErrorCode *)0x0) || (UVar1 = U_FAILURE(*pErrorCode), UVar1 != '\0')) {
    return 0;
  }
  if (((ds == (UDataSwapper *)0x0) || ((inData == (void *)0x0 || (length < -1)))) ||
     ((0 < length && (outData == (void *)0x0)))) {
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    return 0;
  }
  if ((((-1 < length) && (length < 0x18)) || (*(char *)((long)inData + 2) != -0x26)) ||
     ((*(char *)((long)inData + 3) != '\'' || (*(char *)((long)inData + 10) != '\x02')))) {
    udata_printError_63(ds,"udata_swapDataHeader(): initial bytes do not look like ICU data\n");
    *pErrorCode = U_UNSUPPORTED_ERROR;
    return 0;
  }
  uVar2 = (*ds->readUInt16)(*inData);
  uVar3 = (*ds->readUInt16)(*(uint16_t *)((long)inData + 4));
  if (((0x17 < uVar2) && (0x13 < uVar3)) &&
     (((ulong)uVar3 + 4 <= (ulong)uVar2 && ((length < 0 || ((int)(uint)uVar2 <= length)))))) {
    if (0 < length) {
      if (inData != outData) {
        memcpy(outData,inData,(ulong)uVar2);
      }
      *(UBool *)((long)outData + 8) = ds->outIsBigEndian;
      *(uint8_t *)((long)outData + 9) = ds->outCharset;
      (*ds->swapArray16)(ds,inData,2,outData,pErrorCode);
      (*ds->swapArray16)(ds,(void *)((long)inData + 4),4,(void *)((long)outData + 4),pErrorCode);
      uVar4 = uVar3 + 4;
      outData_local._4_4_ = 0;
      while( true ) {
        bVar5 = false;
        if (outData_local._4_4_ < (int)((uint)uVar2 - (uint)uVar4)) {
          bVar5 = *(char *)((long)inData + (long)(int)(uint)uVar4 + (long)outData_local._4_4_) !=
                  '\0';
        }
        if (!bVar5) break;
        outData_local._4_4_ = outData_local._4_4_ + 1;
      }
      (*ds->swapInvChars)(ds,(void *)((long)inData + (long)(int)(uint)uVar4),outData_local._4_4_,
                          (void *)((long)outData + (long)(int)(uint)uVar4),pErrorCode);
    }
    return (uint)uVar2;
  }
  udata_printError_63(ds,
                      "udata_swapDataHeader(): header size mismatch - headerSize %d infoSize %d length %d\n"
                      ,(ulong)uVar2,(ulong)uVar3,(ulong)(uint)length);
  *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
  return 0;
}

Assistant:

U_CAPI int32_t U_EXPORT2
udata_swapDataHeader(const UDataSwapper *ds,
                     const void *inData, int32_t length, void *outData,
                     UErrorCode *pErrorCode) {
    const DataHeader *pHeader;
    uint16_t headerSize, infoSize;

    /* argument checking */
    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return 0;
    }
    if(ds==NULL || inData==NULL || length<-1 || (length>0 && outData==NULL)) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    /* check minimum length and magic bytes */
    pHeader=(const DataHeader *)inData;
    if( (length>=0 && length<(int32_t)sizeof(DataHeader)) ||
        pHeader->dataHeader.magic1!=0xda ||
        pHeader->dataHeader.magic2!=0x27 ||
        pHeader->info.sizeofUChar!=2
    ) {
        udata_printError(ds, "udata_swapDataHeader(): initial bytes do not look like ICU data\n");
        *pErrorCode=U_UNSUPPORTED_ERROR;
        return 0;
    }

    headerSize=ds->readUInt16(pHeader->dataHeader.headerSize);
    infoSize=ds->readUInt16(pHeader->info.size);

    if( headerSize<sizeof(DataHeader) ||
        infoSize<sizeof(UDataInfo) ||
        headerSize<(sizeof(pHeader->dataHeader)+infoSize) ||
        (length>=0 && length<headerSize)
    ) {
        udata_printError(ds, "udata_swapDataHeader(): header size mismatch - headerSize %d infoSize %d length %d\n",
                         headerSize, infoSize, length);
        *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
        return 0;
    }

    if(length>0) {
        DataHeader *outHeader;
        const char *s;
        int32_t maxLength;

        /* Most of the fields are just bytes and need no swapping. */
        if(inData!=outData) {
            uprv_memcpy(outData, inData, headerSize);
        }
        outHeader=(DataHeader *)outData;

        outHeader->info.isBigEndian = ds->outIsBigEndian;
        outHeader->info.charsetFamily = ds->outCharset;

        /* swap headerSize */
        ds->swapArray16(ds, &pHeader->dataHeader.headerSize, 2, &outHeader->dataHeader.headerSize, pErrorCode);

        /* swap UDataInfo size and reservedWord */
        ds->swapArray16(ds, &pHeader->info.size, 4, &outHeader->info.size, pErrorCode);

        /* swap copyright statement after the UDataInfo */
        infoSize+=sizeof(pHeader->dataHeader);
        s=(const char *)inData+infoSize;
        maxLength=headerSize-infoSize;
        /* get the length of the string */
        for(length=0; length<maxLength && s[length]!=0; ++length) {}
        /* swap the string contents */
        ds->swapInvChars(ds, s, length, (char *)outData+infoSize, pErrorCode);
    }

    return headerSize;
}